

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O3

void __thiscall QtMWidgets::BlurEffect::drawBlur(BlurEffect *this,QPainter *p,QColor *c)

{
  long lVar1;
  int iVar2;
  int iVar3;
  QRect dark;
  QColor c1;
  QBrush local_50 [8];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  QColor local_38;
  
  lVar1 = *(long *)&this->field_0x20;
  iVar2 = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
  iVar3 = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
  local_38._0_8_ = *(undefined8 *)c;
  local_38._8_8_ = *(undefined8 *)((long)&c->ct + 4);
  QColor::setAlpha((int)&local_38);
  if (this->orientation == Vertical) {
    local_48 = ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + -2;
    iVar2 = 3;
  }
  else {
    local_48 = 0;
    if (this->orientation == Horizontal) {
      local_44 = ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) + -2;
      iVar3 = 4;
      local_48 = 0;
      goto LAB_00155a38;
    }
  }
  iVar3 = iVar3 + 1;
  local_44 = 0;
LAB_00155a38:
  local_40 = iVar2 + local_48;
  local_3c = local_44 + iVar3 + -1;
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush(local_50,&local_38,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_50);
  QPainter::drawEllipse((QRect *)p);
  return;
}

Assistant:

void
BlurEffect::drawBlur( QPainter * p, const QColor & c )
{
	const QRect r = rect();

	const qreal realPressure = qMin(
		(qreal) qAbs( pressure ) / maxPressure, 1.0 );

	QColor c1 = c;
	c1.setAlpha( 255 * realPressure );

	const QRect dark(
		( orientation == Qt::Vertical ? r.x() + r.width() / 2 - 2 : r.x() ),
		( orientation == Qt::Horizontal ? r.y() + r.height() / 2 - 2 : r.y() ),
		( orientation == Qt::Vertical ? 4 : r.width() ),
		( orientation == Qt::Horizontal ? 4 : r.height() ) );

	p->setPen( Qt::NoPen );
	p->setBrush( c1 );
	p->drawEllipse( dark );
}